

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall
NetInterfaceSim::getString(NetInterfaceSim *this,WifiDebugOstream *log,string *input)

{
  int iVar1;
  undefined1 local_c8 [8];
  timeval timeout;
  fd_set *__arr;
  undefined1 auStack_a8 [4];
  uint __i;
  fd_set readfds;
  string *input_local;
  WifiDebugOstream *log_local;
  NetInterfaceSim *this_local;
  
  timeout.tv_usec = (__suseconds_t)auStack_a8;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    *(undefined8 *)(timeout.tv_usec + (ulong)__arr._4_4_ * 8) = 0;
  }
  local_c8 = (undefined1  [8])0x0;
  timeout.tv_sec = 0;
  _auStack_a8 = _auStack_a8 | 1;
  readfds.fds_bits[0xf] = (__fd_mask)input;
  iVar1 = select(1,(fd_set *)auStack_a8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)local_c8);
  if (iVar1 == 0) {
    std::__cxx11::string::operator=((string *)readfds.fds_bits[0xf],"");
  }
  else {
    std::operator>>((istream *)&std::cin,(string *)readfds.fds_bits[0xf]);
  }
  this_local._7_1_ = iVar1 != 0;
  return this_local._7_1_;
}

Assistant:

bool getString( WifiDebugOstream& log, std::string& input ) override
  {
    fd_set readfds;
    FD_ZERO(&readfds);

    struct timeval timeout;
    timeout.tv_sec = 0;
    timeout.tv_usec = 0;

    FD_SET(STDIN_FILENO, &readfds );
    if ( select(1, &readfds, nullptr, nullptr, &timeout ))
    {
      std::cin >> input;
      return true;
    }
    input = "";
    return false;
  }